

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * wasm::Literal::makeFromMemory(Literal *__return_storage_ptr__,void *p,Type type)

{
  undefined8 uStack_28;
  uint8_t bytes [16];
  
  switch(type.id) {
  case 2:
    (__return_storage_ptr__->field_0).i32 = *p;
    (__return_storage_ptr__->type).id = 2;
    break;
  case 3:
    (__return_storage_ptr__->field_0).i64 = *p;
    (__return_storage_ptr__->type).id = 3;
    break;
  case 4:
    (__return_storage_ptr__->field_0).i32 = *p;
    (__return_storage_ptr__->type).id = 4;
    break;
  case 5:
    (__return_storage_ptr__->field_0).i64 = *p;
    (__return_storage_ptr__->type).id = 5;
    break;
  case 6:
    uStack_28 = *p;
    bytes._0_8_ = *(undefined8 *)((long)p + 8);
    Literal(__return_storage_ptr__,(uint8_t *)&uStack_28);
    break;
  default:
    __assert_fail("type.isNumber()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0x113,"static Literal wasm::Literal::makeFromMemory(void *, Type)");
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::makeFromMemory(void* p, Type type) {
  assert(type.isNumber());
  switch (type.getBasic()) {
    case Type::i32: {
      int32_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(i);
    }
    case Type::i64: {
      int64_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(i);
    }
    case Type::f32: {
      int32_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(bit_cast<float>(i));
    }
    case Type::f64: {
      int64_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(bit_cast<double>(i));
    }
    case Type::v128: {
      uint8_t bytes[16];
      memcpy(bytes, p, sizeof(bytes));
      return Literal(bytes);
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}